

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_sdot_h_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = desc * 8 & 0xff;
  uVar1 = uVar4 + 8;
  uVar3 = (ulong)uVar1;
  uVar5 = 0;
  do {
    *(long *)((long)vd + uVar5 * 8) =
         (long)*(short *)((long)vm + uVar5 * 8 + 4) * (long)*(short *)((long)vn + uVar5 * 8 + 4) +
         (long)*(short *)((long)vm + uVar5 * 8 + 2) * (long)*(short *)((long)vn + uVar5 * 8 + 2) +
         (long)*(short *)((long)vm + uVar5 * 8) * (long)*(short *)((long)vn + uVar5 * 8) +
         *(long *)((long)vd + uVar5 * 8) +
         (long)*(short *)((long)vm + uVar5 * 8 + 6) * (long)*(short *)((long)vn + uVar5 * 8 + 6);
    uVar5 = uVar5 + 1;
  } while (uVar1 >> 3 != uVar5);
  uVar1 = desc >> 2 & 0xf8;
  if (uVar4 < uVar1) {
    uVar2 = (ulong)(uVar1 + 8);
    uVar5 = uVar3 + 8;
    if (uVar3 + 8 < uVar2) {
      uVar5 = uVar2;
    }
    memset((void *)((long)vd + uVar3),0,(~uVar3 + uVar5 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_sdot_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint64_t *d = vd;
    int16_t *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; ++i) {
        d[i] += (int64_t)n[i * 4 + 0] * m[i * 4 + 0]
              + (int64_t)n[i * 4 + 1] * m[i * 4 + 1]
              + (int64_t)n[i * 4 + 2] * m[i * 4 + 2]
              + (int64_t)n[i * 4 + 3] * m[i * 4 + 3];
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}